

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::setBufferBinding(ReferenceContext *this,deUint32 target,DataBuffer *buffer)

{
  int *piVar1;
  VertexArray *pVVar2;
  DataBuffer **ppDVar3;
  
  if ((int)target < 0x8a11) {
    if ((int)target < 0x88eb) {
      if (target == 0x8892) {
        ppDVar3 = &this->m_arrayBufferBinding;
      }
      else {
        if (target != 0x8893) {
          return;
        }
        pVVar2 = &this->m_clientVertexArray;
        if (this->m_vertexArrayBinding != (VertexArray *)0x0) {
          pVVar2 = this->m_vertexArrayBinding;
        }
        ppDVar3 = &pVVar2->m_elementArrayBufferBinding;
      }
    }
    else if (target == 0x88eb) {
      ppDVar3 = &this->m_pixelPackBufferBinding;
    }
    else {
      if (target != 0x88ec) {
        return;
      }
      ppDVar3 = &this->m_pixelUnpackBufferBinding;
    }
  }
  else if ((int)target < 0x8f36) {
    if (target == 0x8a11) {
      ppDVar3 = &this->m_uniformBufferBinding;
    }
    else {
      if (target != 0x8c8e) {
        return;
      }
      ppDVar3 = &this->m_transformFeedbackBufferBinding;
    }
  }
  else if (target == 0x8f36) {
    ppDVar3 = &this->m_copyReadBufferBinding;
  }
  else if (target == 0x8f37) {
    ppDVar3 = &this->m_copyWriteBufferBinding;
  }
  else {
    if (target != 0x8f3f) {
      return;
    }
    ppDVar3 = &this->m_drawIndirectBufferBinding;
  }
  if (*ppDVar3 != (DataBuffer *)0x0) {
    rc::ObjectManager<sglr::rc::DataBuffer>::releaseReference(&this->m_buffers,*ppDVar3);
    *ppDVar3 = (DataBuffer *)0x0;
  }
  if (buffer != (DataBuffer *)0x0) {
    piVar1 = &(buffer->super_NamedObject).m_refCount;
    *piVar1 = *piVar1 + 1;
  }
  *ppDVar3 = buffer;
  return;
}

Assistant:

void ReferenceContext::setBufferBinding (deUint32 target, DataBuffer* buffer)
{
	DataBuffer** bindingPoint = DE_NULL;
	VertexArray* vertexArrayObject = (m_vertexArrayBinding) ? (m_vertexArrayBinding) : (&m_clientVertexArray);

	switch (target)
	{
		case GL_ARRAY_BUFFER:				bindingPoint = &m_arrayBufferBinding;								break;
		case GL_COPY_READ_BUFFER:			bindingPoint = &m_copyReadBufferBinding;							break;
		case GL_COPY_WRITE_BUFFER:			bindingPoint = &m_copyWriteBufferBinding;							break;
		case GL_DRAW_INDIRECT_BUFFER:		bindingPoint = &m_drawIndirectBufferBinding;						break;
		case GL_ELEMENT_ARRAY_BUFFER:		bindingPoint = &vertexArrayObject->m_elementArrayBufferBinding;		break;
		case GL_PIXEL_PACK_BUFFER:			bindingPoint = &m_pixelPackBufferBinding;							break;
		case GL_PIXEL_UNPACK_BUFFER:		bindingPoint = &m_pixelUnpackBufferBinding;							break;
		case GL_TRANSFORM_FEEDBACK_BUFFER:	bindingPoint = &m_transformFeedbackBufferBinding;					break;
		case GL_UNIFORM_BUFFER:				bindingPoint = &m_uniformBufferBinding;								break;
		default:
			DE_ASSERT(false);
			return;
	}

	if (*bindingPoint)
	{
		m_buffers.releaseReference(*bindingPoint);
		*bindingPoint = DE_NULL;
	}

	if (buffer)
		m_buffers.acquireReference(buffer);

	*bindingPoint = buffer;
}